

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::CopyPropagateArrays::MemoryObject::GetAccessIds
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          MemoryObject *this)

{
  IRContext *this_00;
  vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
  *pvVar1;
  size_type __n;
  const_iterator __first;
  const_iterator __last;
  iterator __result;
  allocator<unsigned_int> local_22;
  undefined1 local_21;
  ConstantManager *local_20;
  ConstantManager *const_mgr;
  MemoryObject *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indices;
  
  const_mgr = (ConstantManager *)this;
  this_local = (MemoryObject *)__return_storage_ptr__;
  this_00 = Instruction::context(this->variable_inst_);
  local_20 = IRContext::get_constant_mgr(this_00);
  local_21 = 0;
  pvVar1 = AccessChain(this);
  __n = std::
        vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
        ::size(pvVar1);
  std::allocator<unsigned_int>::allocator(&local_22);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,__n,&local_22);
  std::allocator<unsigned_int>::~allocator(&local_22);
  pvVar1 = AccessChain(this);
  __first = std::
            vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
            ::cbegin(pvVar1);
  pvVar1 = AccessChain(this);
  __last = std::
           vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
           ::cend(pvVar1);
  __result = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(__return_storage_ptr__)
  ;
  std::
  transform<__gnu_cxx::__normal_iterator<spvtools::opt::CopyPropagateArrays::AccessChainEntry_const*,std::vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,spvtools::opt::CopyPropagateArrays::MemoryObject::GetAccessIds()const::__0>
            ((__normal_iterator<const_spvtools::opt::CopyPropagateArrays::AccessChainEntry_*,_std::vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>_>
              )__first._M_current,
             (__normal_iterator<const_spvtools::opt::CopyPropagateArrays::AccessChainEntry_*,_std::vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>_>
              )__last._M_current,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__result._M_current,(anon_class_8_1_fc6c29dc)&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> CopyPropagateArrays::MemoryObject::GetAccessIds() const {
  analysis::ConstantManager* const_mgr =
      variable_inst_->context()->get_constant_mgr();

  std::vector<uint32_t> indices(AccessChain().size());
  std::transform(AccessChain().cbegin(), AccessChain().cend(), indices.begin(),
                 [&const_mgr](const AccessChainEntry& entry) {
                   if (entry.is_result_id) {
                     const analysis::Constant* constant =
                         const_mgr->FindDeclaredConstant(entry.result_id);
                     return constant == nullptr ? 0 : constant->GetU32();
                   }

                   return entry.immediate;
                 });
  return indices;
}